

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Device.cxx
# Opt level: O3

Fl_Display_Device * Fl_Display_Device::display_device(void)

{
  int iVar1;
  Fl_Surface_Device *pFVar2;
  
  if (display_device()::display == '\0') {
    iVar1 = __cxa_guard_acquire(&display_device()::display);
    if (iVar1 != 0) {
      pFVar2 = (Fl_Surface_Device *)operator_new(0x10);
      fl_graphics_driver = (Fl_Graphics_Driver *)operator_new(0x6d0);
      fl_graphics_driver->font_ = 0;
      fl_graphics_driver->size_ = 0;
      fl_graphics_driver->sptr = 0;
      fl_graphics_driver->rstack[0] = (Fl_Region)0x0;
      fl_graphics_driver->fl_clip_state_number = 0;
      fl_graphics_driver->rstackptr = 0;
      (fl_graphics_driver->m).a = 1.0;
      (fl_graphics_driver->m).b = 0.0;
      (fl_graphics_driver->m).c = 0.0;
      (fl_graphics_driver->m).d = 1.0;
      *(undefined4 *)&(fl_graphics_driver->m).x = 0;
      *(undefined4 *)((long)&(fl_graphics_driver->m).x + 4) = 0;
      *(undefined4 *)&(fl_graphics_driver->m).y = 0;
      *(undefined4 *)((long)&(fl_graphics_driver->m).y + 4) = 0;
      fl_graphics_driver->fl_matrix = &fl_graphics_driver->m;
      fl_graphics_driver->p = (XPoint *)0x0;
      fl_graphics_driver->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
      fl_graphics_driver->p_size = 0;
      (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device = (_func_int **)&PTR_class_name_00255760
      ;
      pFVar2->_driver = fl_graphics_driver;
      (pFVar2->super_Fl_Device)._vptr_Fl_Device = (_func_int **)&PTR_class_name_00254a38;
      Fl_Surface_Device::_surface = pFVar2;
      display_device::display = (Fl_Display_Device *)pFVar2;
      __cxa_guard_release(&display_device()::display);
    }
  }
  return display_device::display;
}

Assistant:

Fl_Display_Device *Fl_Display_Device::display_device() {
  static Fl_Display_Device *display = new Fl_Display_Device(new
#if defined(__APPLE__)
                                                                  Fl_Quartz_Graphics_Driver
#elif defined(WIN32)
                                                                  Fl_GDI_Graphics_Driver
#else
                                                                  Fl_Xlib_Graphics_Driver
#endif
                                                                 );
  return display;
}